

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> __thiscall
cmGlobalNinjaGenerator::CreateLinkLineComputer
          (cmGlobalNinjaGenerator *this,cmOutputConverter *outputConverter,cmStateDirectory *param_2
          )

{
  cmNinjaLinkLineComputer *this_00;
  cmStateSnapshot cStack_68;
  cmStateDirectory local_50;
  
  cmLocalGenerator::GetStateSnapshot
            (&cStack_68,
             (cmLocalGenerator *)**(undefined8 **)&outputConverter[1].RelativePathTopSource.field_2)
  ;
  cmStateSnapshot::GetDirectory(&local_50,&cStack_68);
  this_00 = (cmNinjaLinkLineComputer *)operator_new(0x48);
  cmNinjaLinkLineComputer::cmNinjaLinkLineComputer
            (this_00,(cmOutputConverter *)param_2,&local_50,
             (cmGlobalNinjaGenerator *)outputConverter);
  (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator =
       (_func_int **)this_00;
  return (__uniq_ptr_data<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>,_true,_true>)
         (__uniq_ptr_data<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<cmLinkLineComputer>
cmGlobalNinjaGenerator::CreateLinkLineComputer(
  cmOutputConverter* outputConverter,
  cmStateDirectory const& /* stateDir */) const
{
  return std::unique_ptr<cmLinkLineComputer>(
    cm::make_unique<cmNinjaLinkLineComputer>(
      outputConverter,
      this->LocalGenerators[0]->GetStateSnapshot().GetDirectory(), this));
}